

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

void __thiscall
gl4cts::FunctionObject::
binary<tcu::Vector<unsigned_int,_3>,_tcu::Vector<double,_3>,_tcu::Vector<double,_3>_>::call
          (binary<tcu::Vector<unsigned_int,_3>,_tcu::Vector<double,_3>,_tcu::Vector<double,_3>_>
           *this,GLvoid *result_dst,GLvoid *argument_src)

{
  code *pcVar1;
  GLuint GVar2;
  uint local_78 [2];
  uint local_70;
  undefined1 local_6c [8];
  Vector<unsigned_int,_3> result;
  Vector<double,_3> arg_2;
  Vector<double,_3> arg_1;
  functionPointer p_function;
  GLuint argument_1_stride;
  GLvoid *argument_src_local;
  GLvoid *result_dst_local;
  binary<tcu::Vector<unsigned_int,_3>,_tcu::Vector<double,_3>,_tcu::Vector<double,_3>_> *this_local;
  
  GVar2 = GPUShaderFP64Test10::functionObject::getArgumentStride((functionObject *)this,0);
  pcVar1 = (code *)(this->super_binaryBase).super_functionObject.m_p_function;
  tcu::Vector<double,_3>::Vector((Vector<double,_3> *)(arg_2.m_data + 2));
  tcu::Vector<double,_3>::Vector((Vector<double,_3> *)(result.m_data + 1));
  tcu::Vector<unsigned_int,_3>::Vector((Vector<unsigned_int,_3> *)local_6c);
  unpack<tcu::Vector<double,_3>_>::get(argument_src,(Vector<double,_3> *)(arg_2.m_data + 2));
  unpack<tcu::Vector<double,_3>_>::get
            ((GLvoid *)((long)argument_src + (ulong)GVar2),(Vector<double,_3> *)(result.m_data + 1))
  ;
  (*pcVar1)(local_78,arg_2.m_data + 2,result.m_data + 1);
  local_6c._0_4_ = local_78[0];
  local_6c._4_4_ = local_78[1];
  result.m_data[0] = local_70;
  pack<tcu::Vector<unsigned_int,_3>_>::set(result_dst,(Vector<unsigned_int,_3> *)local_6c);
  return;
}

Assistant:

virtual void call(glw::GLvoid* result_dst, const glw::GLvoid* argument_src) const
	{
		const glw::GLuint argument_1_stride = getArgumentStride(0);

		functionPointer p_function = (functionPointer)m_p_function;

		Arg1T arg_1;
		Arg2T arg_2;
		ResT  result;

		unpack<Arg1T>::get(argument_src, arg_1);
		unpack<Arg2T>::get((glw::GLubyte*)argument_src + argument_1_stride, arg_2);

		result = p_function(arg_1, arg_2);

		pack<ResT>::set(result_dst, result);
	}